

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O0

void __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
::setTextures(COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
              *this,ITexture **textures,u32 numTextures,ITexture *depthStencil,
             E_CUBE_SURFACE *cubeSurfaces,u32 numCubeSurfaces)

{
  bool bVar1;
  u32 uVar2;
  E_DRIVER_TYPE EVar3;
  E_TEXTURE_TYPE EVar4;
  GLuint GVar5;
  ECOLOR_FORMAT format;
  Printer *this_00;
  ITexture **ppIVar6;
  ITexture *this_01;
  dimension2d<unsigned_int> *pdVar7;
  undefined8 *puVar8;
  COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *in_RCX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  double __x;
  double __x_00;
  double __x_01;
  ITexture *firstTexture;
  ECOLOR_FORMAT textureFormat;
  GLuint textureID_1;
  COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *currentTexture_1;
  u32 i_1;
  GLuint textureID;
  COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *currentTexture;
  u32 i;
  stringc message;
  array<irr::video::ITexture_*> prevTextures;
  bool needSizeUpdate;
  undefined4 in_stack_ffffffffffffff18;
  u32 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *in_stack_ffffffffffffff28;
  COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *this_02;
  undefined4 in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  ITexture *in_stack_ffffffffffffff38;
  COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  array<irr::video::E_CUBE_SURFACE> *in_stack_ffffffffffffff50;
  uint local_88;
  GLuint local_84;
  uint local_78;
  uint local_74 [17];
  byte local_2d;
  COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *local_20;
  uint local_14;
  long local_10;
  
  local_2d = 0;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  bVar1 = core::array<irr::video::ITexture_*>::equals
                    ((array<irr::video::ITexture_*> *)in_stack_ffffffffffffff38,
                     (ITexture **)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (u32)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  if ((!bVar1) ||
     (bVar1 = core::array<irr::video::E_CUBE_SURFACE>::equals
                        ((array<irr::video::E_CUBE_SURFACE> *)in_stack_ffffffffffffff38,
                         (E_CUBE_SURFACE *)
                         CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (u32)((ulong)in_stack_ffffffffffffff28 >> 0x20)), !bVar1)) {
    local_2d = 1;
    core::array<irr::video::ITexture_*>::array
              ((array<irr::video::ITexture_*> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (array<irr::video::ITexture_*> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if (*(uint *)(in_RDI + 0x88) < local_14) {
      core::string<char>::string<char>
                ((string<char> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      core::string<char>::operator+=
                ((string<char> *)in_stack_ffffffffffffff40,
                 (uint)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      core::string<char>::operator+=
                ((string<char> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      this_00 = (Printer *)core::string<char>::c_str((string<char> *)0x368bc1);
      os::Printer::log(this_00,__x);
      core::string<char>::~string((string<char> *)0x368bd8);
    }
    in_stack_ffffffffffffff50 = (array<irr::video::E_CUBE_SURFACE> *)(in_RDI + 8);
    local_74[0] = *(uint *)(in_RDI + 0x88);
    core::min_<unsigned_int>(&local_14,local_74);
    core::array<irr::video::ITexture_*>::set_used
              ((array<irr::video::ITexture_*> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff1c);
    local_78 = 0;
    while (in_stack_ffffffffffffff4c = local_78,
          uVar2 = core::array<irr::video::ITexture_*>::size
                            ((array<irr::video::ITexture_*> *)0x368c2f),
          in_stack_ffffffffffffff4c < uVar2) {
      if ((*(long *)(local_10 + (ulong)local_78 * 8) == 0) ||
         (EVar3 = ITexture::getDriverType(*(ITexture **)(local_10 + (ulong)local_78 * 8)),
         EVar3 != *(E_DRIVER_TYPE *)(in_RDI + 0x50))) {
        in_stack_ffffffffffffff40 = (COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *)0x0;
      }
      else {
        in_stack_ffffffffffffff40 =
             *(COpenGLCoreTexture<irr::video::COpenGL3DriverBase> **)
              (local_10 + (ulong)local_78 * 8);
      }
      local_84 = 0;
      if (in_stack_ffffffffffffff40 != (COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *)0x0) {
        local_84 = COpenGLCoreTexture<irr::video::COpenGL3DriverBase>::getOpenGLTextureName
                             (in_stack_ffffffffffffff40);
      }
      if (local_84 == 0) {
        ppIVar6 = core::array<irr::video::ITexture_*>::operator[]
                            ((array<irr::video::ITexture_*> *)
                             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                             in_stack_ffffffffffffff1c);
        *ppIVar6 = (ITexture *)0x0;
      }
      else {
        in_stack_ffffffffffffff38 = *(ITexture **)(local_10 + (ulong)local_78 * 8);
        ppIVar6 = core::array<irr::video::ITexture_*>::operator[]
                            ((array<irr::video::ITexture_*> *)
                             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                             in_stack_ffffffffffffff1c);
        *ppIVar6 = in_stack_ffffffffffffff38;
        ppIVar6 = core::array<irr::video::ITexture_*>::operator[]
                            ((array<irr::video::ITexture_*> *)
                             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                             in_stack_ffffffffffffff1c);
        IReferenceCounted::grab
                  ((IReferenceCounted *)
                   ((long)&(*ppIVar6)->_vptr_ITexture + (long)(*ppIVar6)->_vptr_ITexture[-3]));
      }
      local_78 = local_78 + 1;
    }
    local_88 = 0;
    while (in_stack_ffffffffffffff34 = local_88,
          uVar2 = core::array<irr::video::ITexture_*>::size
                            ((array<irr::video::ITexture_*> *)0x368d58),
          in_stack_ffffffffffffff34 < uVar2) {
      ppIVar6 = core::array<irr::video::ITexture_*>::operator[]
                          ((array<irr::video::ITexture_*> *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           in_stack_ffffffffffffff1c);
      if (*ppIVar6 != (ITexture *)0x0) {
        core::array<irr::video::ITexture_*>::operator[]
                  ((array<irr::video::ITexture_*> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff1c);
        IReferenceCounted::drop
                  ((IReferenceCounted *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      }
      local_88 = local_88 + 1;
    }
    *(undefined1 *)(in_RDI + 0x7a) = 1;
    core::array<irr::video::ITexture_*>::~array((array<irr::video::ITexture_*> *)0x368dbe);
  }
  bVar1 = core::array<irr::video::E_CUBE_SURFACE>::equals
                    ((array<irr::video::E_CUBE_SURFACE> *)in_stack_ffffffffffffff38,
                     (E_CUBE_SURFACE *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                     ,(u32)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  if (!bVar1) {
    core::array<irr::video::E_CUBE_SURFACE>::set_data
              (in_stack_ffffffffffffff50,
               (E_CUBE_SURFACE *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               (u32)((ulong)in_stack_ffffffffffffff40 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff40 >> 0x18,0),
               SUB81((ulong)in_stack_ffffffffffffff40 >> 0x10,0));
    *(undefined1 *)(in_RDI + 0x7a) = 1;
  }
  if (*(COpenGLCoreTexture<irr::video::COpenGL3DriverBase> **)(in_RDI + 0x28) != local_20) {
    if (*(long *)(in_RDI + 0x28) != 0) {
      IReferenceCounted::drop
                ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
      ;
      *(undefined8 *)(in_RDI + 0x28) = 0;
    }
    local_2d = 1;
    if ((local_20 == (COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *)0x0) ||
       (EVar3 = ITexture::getDriverType(&local_20->super_ITexture), this_02 = local_20,
       EVar3 != *(E_DRIVER_TYPE *)(in_RDI + 0x50))) {
      this_02 = (COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *)0x0;
    }
    in_stack_ffffffffffffff28 = this_02;
    if (this_02 != (COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *)0x0) {
      EVar4 = ITexture::getType(&this_02->super_ITexture);
      if (EVar4 == ETT_2D) {
        GVar5 = COpenGLCoreTexture<irr::video::COpenGL3DriverBase>::getOpenGLTextureName(this_02);
        if (GVar5 == 0) {
          format = ECF_UNKNOWN;
        }
        else {
          format = ITexture::getColorFormat(&local_20->super_ITexture);
        }
        bVar1 = IImage::isDepthFormat(format);
        if (bVar1) {
          *(COpenGLCoreTexture<irr::video::COpenGL3DriverBase> **)(in_RDI + 0x28) = local_20;
          IReferenceCounted::grab
                    ((IReferenceCounted *)
                     ((long)*(long **)(in_RDI + 0x28) +
                     *(long *)(**(long **)(in_RDI + 0x28) + -0x18)));
        }
        else {
          os::Printer::log((Printer *)"Ignoring depth/stencil texture without depth color format.",
                           __x_01);
        }
      }
      else {
        os::Printer::log((Printer *)"This driver doesn\'t support depth/stencil to cubemaps.",__x_00
                        );
      }
    }
    *(undefined1 *)(in_RDI + 0x7b) = 1;
  }
  if ((local_2d & 1) != 0) {
    this_01 = getTexture((COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
                          *)in_stack_ffffffffffffff28);
    if (this_01 == (ITexture *)0x0) {
      if (*(long *)(in_RDI + 0x28) == 0) {
        puVar8 = (undefined8 *)(**(code **)(**(long **)(in_RDI + 0x90) + 0x1d8))();
        *(undefined8 *)(in_RDI + 0x80) = *puVar8;
      }
      else {
        pdVar7 = ITexture::getSize(*(ITexture **)(in_RDI + 0x28));
        *(dimension2d<unsigned_int> *)(in_RDI + 0x80) = *pdVar7;
      }
    }
    else {
      pdVar7 = ITexture::getSize(this_01);
      *(dimension2d<unsigned_int> *)(in_RDI + 0x80) = *pdVar7;
    }
  }
  return;
}

Assistant:

void setTextures(ITexture *const *textures, u32 numTextures, ITexture *depthStencil, const E_CUBE_SURFACE *cubeSurfaces, u32 numCubeSurfaces) override
	{
		bool needSizeUpdate = false;

		// Set color attachments.
		if (!Textures.equals(textures, numTextures) || !CubeSurfaces.equals(cubeSurfaces, numCubeSurfaces)) {
			needSizeUpdate = true;

			core::array<ITexture *> prevTextures(Textures);

			if (numTextures > static_cast<u32>(ColorAttachment)) {
				core::stringc message = "This GPU supports up to ";
				message += static_cast<u32>(ColorAttachment);
				message += " textures per render target.";

				os::Printer::log(message.c_str(), ELL_WARNING);
			}

			Textures.set_used(core::min_(numTextures, static_cast<u32>(ColorAttachment)));

			for (u32 i = 0; i < Textures.size(); ++i) {
				TOpenGLTexture *currentTexture = (textures[i] && textures[i]->getDriverType() == DriverType) ? static_cast<TOpenGLTexture *>(textures[i]) : 0;

				GLuint textureID = 0;

				if (currentTexture) {
					textureID = currentTexture->getOpenGLTextureName();
				}

				if (textureID != 0) {
					Textures[i] = textures[i];
					Textures[i]->grab();
				} else {
					Textures[i] = 0;
				}
			}

			for (u32 i = 0; i < prevTextures.size(); ++i) {
				if (prevTextures[i])
					prevTextures[i]->drop();
			}

			RequestTextureUpdate = true;
		}

		if (!CubeSurfaces.equals(cubeSurfaces, numCubeSurfaces)) {
			CubeSurfaces.set_data(cubeSurfaces, numCubeSurfaces);
			RequestTextureUpdate = true;
		}

		// Set depth and stencil attachments.
		if (DepthStencil != depthStencil) {
			if (DepthStencil) {
				DepthStencil->drop();
				DepthStencil = 0;
			}

			needSizeUpdate = true;
			TOpenGLTexture *currentTexture = (depthStencil && depthStencil->getDriverType() == DriverType) ? static_cast<TOpenGLTexture *>(depthStencil) : 0;

			if (currentTexture) {
				if (currentTexture->getType() == ETT_2D) {
					GLuint textureID = currentTexture->getOpenGLTextureName();

					const ECOLOR_FORMAT textureFormat = (textureID != 0) ? depthStencil->getColorFormat() : ECF_UNKNOWN;
					if (IImage::isDepthFormat(textureFormat)) {
						DepthStencil = depthStencil;
						DepthStencil->grab();
					} else {
						os::Printer::log("Ignoring depth/stencil texture without depth color format.", ELL_WARNING);
					}
				} else {
					os::Printer::log("This driver doesn't support depth/stencil to cubemaps.", ELL_WARNING);
				}
			}

			RequestDepthStencilUpdate = true;
		}

		if (needSizeUpdate) {
			// Set size required for a viewport.

			ITexture *firstTexture = getTexture();

			if (firstTexture)
				Size = firstTexture->getSize();
			else {
				if (DepthStencil)
					Size = DepthStencil->getSize();
				else
					Size = Driver->getScreenSize();
			}
		}
	}